

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err nni_http_server_start(nni_http_server *s)

{
  nng_err local_14;
  int rv;
  nni_http_server *s_local;
  
  local_14 = NNG_OK;
  nni_mtx_lock(&s->mtx);
  if (s->starts == 0) {
    local_14 = http_server_start(s);
  }
  if (local_14 == NNG_OK) {
    s->starts = s->starts + 1;
  }
  nni_mtx_unlock(&s->mtx);
  return local_14;
}

Assistant:

nng_err
nni_http_server_start(nni_http_server *s)
{
	int rv = NNG_OK;

	nni_mtx_lock(&s->mtx);
	if (s->starts == 0) {
		rv = http_server_start(s);
	}
	if (rv == NNG_OK) {
		s->starts++;
	}
	nni_mtx_unlock(&s->mtx);
	return (rv);
}